

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetMaxBetaFails(void *kinmem,long mxnbcf)

{
  KINMem kin_mem;
  long mxnbcf_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetMaxBetaFails","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (mxnbcf < 0) {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetMaxBetaFails","mxbcf < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  else {
    if (mxnbcf == 0) {
      *(undefined8 *)((long)kinmem + 0x48) = 10;
    }
    else {
      *(long *)((long)kinmem + 0x48) = mxnbcf;
    }
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetMaxBetaFails(void *kinmem, long int mxnbcf)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetMaxBetaFails", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (mxnbcf < 0) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetMaxBetaFails", MSG_BAD_MXNBCF);
    return(KIN_ILL_INPUT);
  }

  if (mxnbcf == 0)
    kin_mem->kin_mxnbcf = MXNBCF_DEFAULT;
  else
    kin_mem->kin_mxnbcf = mxnbcf;

  return(KIN_SUCCESS);

}